

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignIdByAnyCellmlElement_Test::Annotator_assignIdByAnyCellmlElement_Test
          (Annotator_assignIdByAnyCellmlElement_Test *this)

{
  Annotator_assignIdByAnyCellmlElement_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Annotator_assignIdByAnyCellmlElement_Test_001c29e0;
  return;
}

Assistant:

TEST(Annotator, assignIdByAnyCellmlElement)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);

    annotator->setModel(model);

    auto item = annotator->item("duplicateId4", 3);

    EXPECT_EQ(size_t(7), annotator->itemCount("duplicateId4"));
    EXPECT_EQ("b4da55", annotator->assignId(item));
    EXPECT_EQ(size_t(6), annotator->itemCount("duplicateId4"));
}